

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O3

ssize_t __thiscall LibGens::Ym2612::write(Ym2612 *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  Ym2612Private *pYVar2;
  uint uVar3;
  uint8_t data;
  int address;
  long lVar4;
  
  data = (uint8_t)__buf;
  uVar1 = (uint)__buf;
  switch(__fd & 3) {
  case 0:
    (this->d->state).OPNAadr = uVar1 & 0xff;
    return 0;
  case 1:
    pYVar2 = this->d;
    uVar3 = (pYVar2->state).OPNAadr;
    lVar4 = (long)(int)uVar3;
    if (lVar4 == 0x2a) {
      (pYVar2->state).DACdata = (uVar1 & 0xff) * 0x80 + -0x4000;
      return 0;
    }
    uVar3 = uVar3 & 0xf0;
    if (uVar3 < 0x30) {
      (pYVar2->state).REG[0][lVar4] = data;
      Ym2612Private::YM_SET(this->d,(this->d->state).OPNAadr,data);
      return 0;
    }
    if ((pYVar2->state).REG[0][lVar4] == data) {
      return 2;
    }
    (pYVar2->state).REG[0][lVar4] = data;
    pYVar2 = this->d;
    address = (pYVar2->state).OPNAadr;
    break;
  case 2:
    (this->d->state).OPNBadr = uVar1 & 0xff;
    return 0;
  case 3:
    pYVar2 = this->d;
    uVar1 = (pYVar2->state).OPNBadr;
    uVar3 = uVar1 & 0xf0;
    if (uVar3 < 0x30) {
      return 1;
    }
    if ((pYVar2->state).REG[1][(int)uVar1] == data) {
      return 2;
    }
    (pYVar2->state).REG[1][(int)uVar1] = data;
    pYVar2 = this->d;
    address = (pYVar2->state).OPNBadr + 0x100;
  }
  if (uVar3 < 0xa0) {
    Ym2612Private::SLOT_SET(pYVar2,address,data);
  }
  else {
    Ym2612Private::CHANNEL_SET(pYVar2,address,data);
  }
  return 0;
}

Assistant:

int Ym2612::write(unsigned int address, uint8_t data)
{
	/**
	 * Possible addresses:
	 * - 0: Bank 0 register number.
	 * - 1: Bank 0 data.
	 * - 2: Bank 1 register number.
	 * - 3: Bank 1 data.
	 */

	int reg_num;
	switch (address & 0x03) {
		case 0:
			d->state.OPNAadr = data;
			break;

		case 1:
			// Trivial optimization for DAC.
			if (d->state.OPNAadr == 0x2A) {
				d->state.DACdata = ((int)data - 0x80) << 7;
				return 0;
			}

			reg_num = d->state.OPNAadr & 0xF0;
			if (reg_num >= 0x30) {
				if (d->state.REG[0][d->state.OPNAadr] == data) {
					// Don't bother doing anything if the
					// register has the same value.
					// TODO: Is this correct?
					return 2;
				}
				d->state.REG[0][d->state.OPNAadr] = data;

				if (reg_num < 0xA0) {
					d->SLOT_SET(d->state.OPNAadr, data);
				} else {
					d->CHANNEL_SET(d->state.OPNAadr, data);
				}
			} else {
				// YM2612 control registers.
				d->state.REG[0][d->state.OPNAadr] = data;

				/* TODO: Reimplement GYM dumping support in LibGens.
				if ((GYM_Dumping) &&
				    ((d->state.OPNAadr == 0x22) ||
				     (d->state.OPNAadr == 0x27) ||
				     (d->state.OPNAadr == 0x28)))
				{
					gym_dump_update(1, (uint8_t)d->state.OPNAadr, data);
				}
				*/

				d->YM_SET(d->state.OPNAadr, data);
			}
			break;

		case 2:
			d->state.OPNBadr = data;
			break;

		case 3:
			reg_num = d->state.OPNBadr & 0xF0;

			if (reg_num >= 0x30) {
				if (d->state.REG[1][d->state.OPNBadr] == data) {
					// Don't bother doing anything if the
					// register has the same value.
					// TODO: Is this correct?
					return 2;
				}
				d->state.REG[1][d->state.OPNBadr] = data;

				/* TODO: Reimplement GYM dumping support in LibGens.
				if (GYM_Dumping)
					gym_dump_update(2, (uint8_t)d->state.OPNBadr, data);
				*/

				if (reg_num < 0xA0) {
					d->SLOT_SET(d->state.OPNBadr + 0x100, data);
				} else {
					d->CHANNEL_SET(d->state.OPNBadr + 0x100, data);
				}
			} else {
				// Invalid register.
				// TODO: Save the value anyway?
				return 1;
			}
			break;
	}

	return 0;
}